

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

ssize_t __thiscall Matrix::read(Matrix *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long lVar4;
  uint local_6c;
  shared_array<double> local_40;
  uint local_2c;
  int *piStack_28;
  uint s;
  int *sizes;
  uint dimension;
  int i_local;
  Matrix *this_local;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  sizes._4_4_ = (int)__buf;
  if (*(int *)(lVar4 + 0xd8) == 1) {
    local_6c = 1;
  }
  else {
    local_6c = *(int *)(lVar4 + 0xd8) - 1;
  }
  sizes._0_4_ = local_6c;
  uVar2 = SUB168(ZEXT416(local_6c) * ZEXT816(4),0);
  if (SUB168(ZEXT416(local_6c) * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  _dimension = lVar4;
  this_local = this;
  piStack_28 = (int *)operator_new__(uVar2);
  *piStack_28 = 1;
  for (local_2c = 1; local_2c < *(uint *)(lVar4 + 0xd8); local_2c = local_2c + 1) {
    piStack_28[local_2c - 1] = *(int *)(*(long *)(lVar4 + 0xc0) + (ulong)local_2c * 4);
  }
  lVar1 = *(long *)(lVar4 + 0xa0);
  iVar3 = sizes._4_4_ * **(int **)(lVar4 + 200);
  boost::shared_array<double>::shared_array(&local_40,(shared_array<double> *)(lVar4 + 0xa8));
  Matrix(this,(double *)(lVar1 + (long)iVar3 * 8),&local_40,piStack_28,(uint)sizes);
  boost::shared_array<double>::~shared_array(&local_40);
  return (ssize_t)this;
}

Assistant:

const Matrix Matrix::read(int i) const
{
    uint dimension = uint(nMatrixDimension==1 ? 1 : nMatrixDimension-1);
    int *sizes = new int[dimension];
    sizes[0] = 1;
    for (uint s=1; s<uint(nMatrixDimension); s++)
         sizes[s-1] = pSize[s];
    return Matrix( &(pData[i*pMult[0]]), matrixParent, sizes, dimension );
}